

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getAttribute
          (QPDFPageObjectHelper *this,string *name,bool copy_if_shared,
          function<QPDFObjectHandle_()> *get_fallback,bool copy_if_fallback)

{
  _Rb_tree_header *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *__r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  QPDFObjGen og;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  undefined4 in_R9D;
  size_type *psVar2;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle dict;
  QPDFObjectHandle node;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [24];
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_a8;
  long local_78;
  string local_70;
  undefined1 local_50 [32];
  
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000011,copy_if_shared);
  local_78 = CONCAT71(in_register_00000081,copy_if_fallback);
  local_c0._20_4_ = SUB84(get_fallback,0);
  psVar2 = &name->_M_string_length;
  local_c0._16_4_ = in_R9D;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)psVar2);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_a8);
  this_00 = &local_a8._M_impl.super__Rb_tree_header;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)psVar2);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_impl.super__Rb_tree_header
              );
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_c0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)psVar2);
  }
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_c0);
  if (bVar1) {
LAB_001a5d11:
    bVar1 = false;
  }
  else {
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    __lhs = local_c8;
    if (!bVar1) goto LAB_001a5d11;
    bVar1 = std::operator==(local_c8,"/MediaBox");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"/CropBox");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"/Resources");
        if (!bVar1) {
          bVar1 = std::operator==(__lhs,"/Rotate");
          if (!bVar1) goto LAB_001a5d11;
        }
      }
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
    local_a8._M_impl._0_8_ = (element_type *)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    __r = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10);
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
    do {
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_50);
      bVar1 = QPDFObjGen::set::add((set *)&local_a8,og);
      if (!bVar1) {
LAB_001a5d15:
        bVar1 = false;
        goto LAB_001a5d17;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"/Parent",(allocator<char> *)__r);
      bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) goto LAB_001a5d15;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/Parent",&local_c9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)__r,(string *)local_50);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,__r);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
      std::__cxx11::string::~string((string *)&local_70);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_70,(string *)local_50);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
      bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    } while (bVar1);
    bVar1 = true;
LAB_001a5d17:
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree(&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  }
  if (local_c0[0x14] != '\0') {
    if (!bVar1) {
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this);
      if (!bVar1) goto LAB_001a5d8d;
    }
    QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_70);
    QPDFObjectHandle::replaceKeyAndGetNew
              ((QPDFObjectHandle *)&local_a8,(string *)local_c0,(QPDFObjectHandle *)local_c8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_impl.super__Rb_tree_header
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
  }
LAB_001a5d8d:
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
  if ((bVar1) && (*(long *)(local_78 + 0x10) != 0)) {
    std::function<QPDFObjectHandle_()>::operator()((function<QPDFObjectHandle_()> *)&local_a8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_impl.super__Rb_tree_header
              );
    if (local_c0[0x10] != '\0') {
      bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
      if (!bVar1) {
        QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_70);
        QPDFObjectHandle::replaceKeyAndGetNew
                  ((QPDFObjectHandle *)&local_a8,(string *)local_c0,(QPDFObjectHandle *)local_c8);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_a8._M_impl.super__Rb_tree_header);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getAttribute(
    std::string const& name,
    bool copy_if_shared,
    std::function<QPDFObjectHandle()> get_fallback,
    bool copy_if_fallback)
{
    const bool is_form_xobject = oh().isFormXObject();
    bool inherited = false;
    auto dict = is_form_xobject ? oh().getDict() : oh();
    auto result = dict.getKey(name);

    if (!is_form_xobject && result.isNull() &&
        (name == "/MediaBox" || name == "/CropBox" || name == "/Resources" || name == "/Rotate")) {
        QPDFObjectHandle node = dict;
        QPDFObjGen::set seen{};
        while (seen.add(node) && node.hasKey("/Parent")) {
            node = node.getKey("/Parent");
            result = node.getKey(name);
            if (!result.isNull()) {
                QTC::TC("qpdf", "QPDFPageObjectHelper non-trivial inheritance");
                inherited = true;
                break;
            }
        }
    }
    if (copy_if_shared && (inherited || result.isIndirect())) {
        QTC::TC("qpdf", "QPDFPageObjectHelper copy shared attribute", is_form_xobject ? 0 : 1);
        result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
    }
    if (result.isNull() && get_fallback) {
        result = get_fallback();
        if (copy_if_fallback && !result.isNull()) {
            QTC::TC("qpdf", "QPDFPageObjectHelper copied fallback");
            result = dict.replaceKeyAndGetNew(name, result.shallowCopy());
        } else {
            QTC::TC("qpdf", "QPDFPageObjectHelper used fallback without copying");
        }
    }
    return result;
}